

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O1

void __thiscall
wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::CollectedFuncInfo,(wasm::
Mutability)0,wasm::ModuleUtils::DefaultMap>::doAnalysis(std::function<void(wasm::Function*,wasm::
(anonymous_namespace)::CollectedFuncInfo&)>)::Mapper::doWalkFunction(wasm::Function__
          (void *this,Function *curr)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::CollectedFuncInfo>,_std::_Select1st<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::CollectedFuncInfo>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::CollectedFuncInfo>_>_>
  *this_00;
  _Base_ptr p_Var2;
  _Link_type __z;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  const_iterator __position;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar5;
  Function *local_48;
  __aligned_membuf<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::CollectedFuncInfo>_>
  *local_40;
  void *local_38;
  
  this_00 = *(_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::CollectedFuncInfo>,_std::_Select1st<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::CollectedFuncInfo>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::CollectedFuncInfo>_>_>
              **)((long)this + 0x138);
  p_Var1 = &(this_00->_M_impl).super__Rb_tree_header;
  p_Var2 = (this_00->_M_impl).super__Rb_tree_header._M_header._M_parent;
  p_Var4 = p_Var2;
  p_Var3 = &p_Var1->_M_header;
  for (; p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[*(Function **)(p_Var4 + 1) < curr]) {
    if (*(Function **)(p_Var4 + 1) >= curr) {
      p_Var3 = p_Var4;
    }
  }
  p_Var4 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var3 != p_Var1) && (p_Var4 = p_Var3, curr < *(Function **)(p_Var3 + 1)))
  {
    p_Var4 = &p_Var1->_M_header;
  }
  __position._M_node = &p_Var1->_M_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var1) {
    for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[*(Function **)(p_Var2 + 1) < curr])
    {
      if (*(Function **)(p_Var2 + 1) >= curr) {
        __position._M_node = p_Var2;
      }
    }
    if (((_Rb_tree_header *)__position._M_node == p_Var1) ||
       (curr < *(Function **)(__position._M_node + 1))) {
      local_38 = this;
      __z = (_Link_type)operator_new(200);
      local_40 = &__z->_M_storage;
      *(Function **)(__z->_M_storage)._M_storage = curr;
      memset((__z->_M_storage)._M_storage + 8,0,0xa0);
      *(uchar **)((__z->_M_storage)._M_storage + 0x38) = (__z->_M_storage)._M_storage + 0x68;
      (__z->_M_storage)._M_storage[0x40] = '\x01';
      (__z->_M_storage)._M_storage[0x41] = '\0';
      (__z->_M_storage)._M_storage[0x42] = '\0';
      (__z->_M_storage)._M_storage[0x43] = '\0';
      (__z->_M_storage)._M_storage[0x44] = '\0';
      (__z->_M_storage)._M_storage[0x45] = '\0';
      (__z->_M_storage)._M_storage[0x46] = '\0';
      (__z->_M_storage)._M_storage[0x47] = '\0';
      (__z->_M_storage)._M_storage[0x48] = '\0';
      (__z->_M_storage)._M_storage[0x49] = '\0';
      (__z->_M_storage)._M_storage[0x4a] = '\0';
      (__z->_M_storage)._M_storage[0x4b] = '\0';
      (__z->_M_storage)._M_storage[0x4c] = '\0';
      (__z->_M_storage)._M_storage[0x4d] = '\0';
      (__z->_M_storage)._M_storage[0x4e] = '\0';
      (__z->_M_storage)._M_storage[0x4f] = '\0';
      (__z->_M_storage)._M_storage[0x50] = '\0';
      (__z->_M_storage)._M_storage[0x51] = '\0';
      (__z->_M_storage)._M_storage[0x52] = '\0';
      (__z->_M_storage)._M_storage[0x53] = '\0';
      (__z->_M_storage)._M_storage[0x54] = '\0';
      (__z->_M_storage)._M_storage[0x55] = '\0';
      (__z->_M_storage)._M_storage[0x56] = '\0';
      (__z->_M_storage)._M_storage[0x57] = '\0';
      (__z->_M_storage)._M_storage[0x58] = '\0';
      (__z->_M_storage)._M_storage[0x59] = '\0';
      (__z->_M_storage)._M_storage[0x5a] = 0x80;
      (__z->_M_storage)._M_storage[0x5b] = '?';
      (__z->_M_storage)._M_storage[0x60] = '\0';
      (__z->_M_storage)._M_storage[0x61] = '\0';
      (__z->_M_storage)._M_storage[0x62] = '\0';
      (__z->_M_storage)._M_storage[99] = '\0';
      (__z->_M_storage)._M_storage[100] = '\0';
      (__z->_M_storage)._M_storage[0x65] = '\0';
      (__z->_M_storage)._M_storage[0x66] = '\0';
      (__z->_M_storage)._M_storage[0x67] = '\0';
      (__z->_M_storage)._M_storage[0x68] = '\0';
      (__z->_M_storage)._M_storage[0x69] = '\0';
      (__z->_M_storage)._M_storage[0x6a] = '\0';
      (__z->_M_storage)._M_storage[0x6b] = '\0';
      (__z->_M_storage)._M_storage[0x6c] = '\0';
      (__z->_M_storage)._M_storage[0x6d] = '\0';
      (__z->_M_storage)._M_storage[0x6e] = '\0';
      (__z->_M_storage)._M_storage[0x6f] = '\0';
      *(uchar **)((__z->_M_storage)._M_storage + 0x70) = (__z->_M_storage)._M_storage + 0xa0;
      (__z->_M_storage)._M_storage[0x78] = '\x01';
      (__z->_M_storage)._M_storage[0x79] = '\0';
      (__z->_M_storage)._M_storage[0x7a] = '\0';
      (__z->_M_storage)._M_storage[0x7b] = '\0';
      (__z->_M_storage)._M_storage[0x7c] = '\0';
      (__z->_M_storage)._M_storage[0x7d] = '\0';
      (__z->_M_storage)._M_storage[0x7e] = '\0';
      (__z->_M_storage)._M_storage[0x7f] = '\0';
      (__z->_M_storage)._M_storage[0x80] = '\0';
      (__z->_M_storage)._M_storage[0x81] = '\0';
      (__z->_M_storage)._M_storage[0x82] = '\0';
      (__z->_M_storage)._M_storage[0x83] = '\0';
      (__z->_M_storage)._M_storage[0x84] = '\0';
      (__z->_M_storage)._M_storage[0x85] = '\0';
      (__z->_M_storage)._M_storage[0x86] = '\0';
      (__z->_M_storage)._M_storage[0x87] = '\0';
      (__z->_M_storage)._M_storage[0x88] = '\0';
      (__z->_M_storage)._M_storage[0x89] = '\0';
      (__z->_M_storage)._M_storage[0x8a] = '\0';
      (__z->_M_storage)._M_storage[0x8b] = '\0';
      (__z->_M_storage)._M_storage[0x8c] = '\0';
      (__z->_M_storage)._M_storage[0x8d] = '\0';
      (__z->_M_storage)._M_storage[0x8e] = '\0';
      (__z->_M_storage)._M_storage[0x8f] = '\0';
      (__z->_M_storage)._M_storage[0x90] = '\0';
      (__z->_M_storage)._M_storage[0x91] = '\0';
      (__z->_M_storage)._M_storage[0x92] = 0x80;
      (__z->_M_storage)._M_storage[0x93] = '?';
      (__z->_M_storage)._M_storage[0x98] = '\0';
      (__z->_M_storage)._M_storage[0x99] = '\0';
      (__z->_M_storage)._M_storage[0x9a] = '\0';
      (__z->_M_storage)._M_storage[0x9b] = '\0';
      (__z->_M_storage)._M_storage[0x9c] = '\0';
      (__z->_M_storage)._M_storage[0x9d] = '\0';
      (__z->_M_storage)._M_storage[0x9e] = '\0';
      (__z->_M_storage)._M_storage[0x9f] = '\0';
      (__z->_M_storage)._M_storage[0xa0] = '\0';
      (__z->_M_storage)._M_storage[0xa1] = '\0';
      (__z->_M_storage)._M_storage[0xa2] = '\0';
      (__z->_M_storage)._M_storage[0xa3] = '\0';
      (__z->_M_storage)._M_storage[0xa4] = '\0';
      (__z->_M_storage)._M_storage[0xa5] = '\0';
      (__z->_M_storage)._M_storage[0xa6] = '\0';
      (__z->_M_storage)._M_storage[0xa7] = '\0';
      pVar5 = std::
              _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::CollectedFuncInfo>,_std::_Select1st<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::CollectedFuncInfo>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::CollectedFuncInfo>_>_>
              ::_M_get_insert_hint_unique_pos(this_00,__position,(key_type *)local_40);
      if (pVar5.second == (_Base_ptr)0x0) {
        std::
        _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::CollectedFuncInfo>,_std::_Select1st<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::CollectedFuncInfo>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::CollectedFuncInfo>_>_>
        ::_M_drop_node((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::CollectedFuncInfo>,_std::_Select1st<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::CollectedFuncInfo>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::CollectedFuncInfo>_>_>
                        *)__z,(_Link_type)__position._M_node);
        this = local_38;
        __position._M_node = (_Base_ptr)pVar5.first;
      }
      else {
        std::
        _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::CollectedFuncInfo>,_std::_Select1st<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::CollectedFuncInfo>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::CollectedFuncInfo>_>_>
        ::_M_insert_node(this_00,(_Base_ptr)pVar5.first,pVar5.second,__z);
        this = local_38;
        __position._M_node = (_Base_ptr)__z;
      }
    }
    local_48 = curr;
    if (*(long *)((long)this + 0x150) == 0) {
      std::__throw_bad_function_call();
    }
    (**(code **)((long)this + 0x158))
              ((long)this + 0x140,&local_48,
               (((_Link_type)__position._M_node)->_M_storage)._M_storage + 8);
    return;
  }
  __assert_fail("map.count(curr)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-utils.h"
                ,0x13e,
                "void wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous namespace)::CollectedFuncInfo>::doAnalysis(Func)::Mapper::doWalkFunction(Function *) [T = wasm::(anonymous namespace)::CollectedFuncInfo, Mut = wasm::Immutable, MapT = wasm::ModuleUtils::DefaultMap]"
               );
}

Assistant:

void doWalkFunction(Function* curr) {
        assert(map.count(curr));
        work(curr, map[curr]);
      }